

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

bool TdokuConstrain(bool pencilmark,char *puzzle)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  bool bVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  State *pSVar15;
  long lVar16;
  long lVar17;
  Box *pBVar18;
  char cVar19;
  uint uVar20;
  ushort uVar21;
  uint uVar22;
  int iVar23;
  uint *puVar24;
  bool bVar25;
  Cells16 restrict;
  vector<int,_std::allocator<int>_> permutation;
  State state;
  State test_state;
  Cells16 local_660;
  uint *local_640;
  Box *local_638;
  char *local_630;
  Box *local_628;
  Box *local_620;
  vector<int,_std::allocator<int>_> local_618;
  State local_600;
  State local_420;
  State local_240;
  
  pSVar15 = &local_600;
  lVar16 = 0;
  do {
    *(undefined8 *)((long)local_600.bands[0][1].configurations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].configurations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].eliminations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].eliminations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][2].configurations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][2].configurations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][2].eliminations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][2].eliminations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][0].configurations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][0].configurations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][0].eliminations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][0].eliminations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].configurations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].configurations.vec + lVar16 + 8) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].eliminations.vec + lVar16) = 0;
    *(undefined8 *)((long)local_600.bands[0][1].eliminations.vec + lVar16 + 8) = 0;
    lVar17 = 0x10;
    do {
      puVar2 = (undefined8 *)((long)(pSVar15->bands + -1) + 0x50 + lVar17);
      *puVar2 = 0x1ff01ff01ff01ff;
      puVar2[1] = 0x1ff01ff;
      puVar2 = (undefined8 *)((long)pSVar15->bands[0][0].configurations.vec + lVar17);
      *puVar2 = 0;
      puVar2[1] = 0;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x70);
    lVar16 = lVar16 + 0x60;
    pSVar15 = (State *)(pSVar15->bands + 1);
  } while (lVar16 != 0xc0);
  lVar16 = 0xc0;
  do {
    *(undefined8 *)((long)local_600.bands[0][0].configurations.vec + lVar16) = 0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_600.bands[0][0].configurations.vec + lVar16 + 8) = 0x1ff01ff01ff01ff
    ;
    *(undefined8 *)((long)local_600.bands[0][0].eliminations.vec + lVar16) = 0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_600.bands[0][0].eliminations.vec + lVar16 + 8) = 0x1ff01ff01ff01ff;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0x1e0);
  if (pencilmark) {
    anon_unknown.dwarf_43::SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle,&local_600);
  }
  else {
    anon_unknown.dwarf_43::SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle,&local_600);
  }
  Util::Permutation(&local_618,(Util *)((anonymous_namespace)::generator + 0x220),0x2d9);
  local_640 = (uint *)local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
  bVar25 = local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start !=
           local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (bVar25) {
    local_628 = local_600.boxen;
    local_638 = local_420.boxen;
    local_620 = local_240.boxen;
    bVar25 = true;
    puVar24 = (uint *)local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    local_630 = puzzle;
    do {
      uVar5 = *puVar24;
      uVar22 = (int)uVar5 / 9;
      iVar23 = 3;
      if (pencilmark) {
        if (puzzle[(int)uVar5] != '.') {
LAB_00104131:
          iVar23 = ((int)uVar5 / 0xf3) * 3 + ((int)uVar22 % 9) / 3;
          uVar1 = ((int)uVar22 % 9) % 3 + ((int)uVar5 / 0x51) * 4 + (((int)uVar5 / 0x51) / 3) * -0xc
          ;
          pBVar18 = local_628 + iVar23;
          uVar21 = *(ushort *)((long)(pBVar18->cells).vec + (ulong)(uVar1 & 0xf) * 2);
          uVar20 = 1 << uVar5 % 9;
          if ((uVar20 != uVar21) && ((uVar20 & uVar21) != 0)) {
            lVar7 = (pBVar18->cells).vec[0];
            lVar8 = (pBVar18->cells).vec[1];
            lVar9 = (pBVar18->cells).vec[2];
            lVar10 = (pBVar18->cells).vec[3];
            if (!pencilmark) {
              uVar21 = 0;
            }
            local_660.vec[0] = lVar7;
            local_660.vec[1] = lVar8;
            local_660.vec[2] = lVar9;
            local_660.vec[3] = lVar10;
            if (uVar1 < 0x10) {
              uVar21 = uVar21 ^ (ushort)uVar20;
              switch(uVar1) {
              case 0:
                local_660.vec[0] = CONCAT62((int6)((ulong)lVar7 >> 0x10),uVar21);
                break;
              case 1:
                local_660.vec[0]._4_4_ = (undefined4)((ulong)lVar7 >> 0x20);
                local_660.vec[0]._0_4_ = CONCAT22(uVar21,(short)lVar7);
                break;
              case 2:
                local_660.vec[0]._6_2_ = (undefined2)((ulong)lVar7 >> 0x30);
                local_660.vec[0]._0_4_ = (undefined4)lVar7;
                local_660.vec[0]._0_6_ = CONCAT24(uVar21,(undefined4)local_660.vec[0]);
                break;
              case 3:
                local_660.vec[0]._0_6_ = (undefined6)lVar7;
                local_660.vec[0] = CONCAT26(uVar21,(undefined6)local_660.vec[0]);
                break;
              case 4:
                local_660.vec[1] = CONCAT62((int6)((ulong)lVar8 >> 0x10),uVar21);
                break;
              case 5:
                local_660.vec[1]._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
                local_660.vec[1]._0_4_ = CONCAT22(uVar21,(short)lVar8);
                break;
              case 6:
                local_660.vec[1]._6_2_ = (undefined2)((ulong)lVar8 >> 0x30);
                local_660.vec[1]._0_4_ = (undefined4)lVar8;
                local_660.vec[1]._0_6_ = CONCAT24(uVar21,(undefined4)local_660.vec[1]);
                break;
              case 7:
                local_660.vec[1]._0_6_ = (undefined6)lVar8;
                local_660.vec[1] = CONCAT26(uVar21,(undefined6)local_660.vec[1]);
                break;
              case 8:
                local_660.vec[2] = CONCAT62((int6)((ulong)lVar9 >> 0x10),uVar21);
                break;
              case 9:
                local_660.vec[2]._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
                local_660.vec[2]._0_4_ = CONCAT22(uVar21,(short)lVar9);
                break;
              case 10:
                local_660.vec[2]._6_2_ = (undefined2)((ulong)lVar9 >> 0x30);
                local_660.vec[2]._0_4_ = (undefined4)lVar9;
                local_660.vec[2]._0_6_ = CONCAT24(uVar21,(undefined4)local_660.vec[2]);
                break;
              case 0xb:
                local_660.vec[2]._0_6_ = (undefined6)lVar9;
                local_660.vec[2] = CONCAT26(uVar21,(undefined6)local_660.vec[2]);
                break;
              case 0xc:
                local_660.vec[3] = CONCAT62((int6)((ulong)lVar10 >> 0x10),uVar21);
                break;
              case 0xd:
                local_660.vec[3]._4_4_ = (undefined4)((ulong)lVar10 >> 0x20);
                local_660.vec[3]._0_4_ = CONCAT22(uVar21,(short)lVar10);
                break;
              case 0xe:
                local_660.vec[3]._6_2_ = (undefined2)((ulong)lVar10 >> 0x30);
                local_660.vec[3]._0_4_ = (undefined4)lVar10;
                local_660.vec[3]._0_6_ = CONCAT24(uVar21,(undefined4)local_660.vec[3]);
                break;
              case 0xf:
                local_660.vec[3]._0_6_ = (undefined6)lVar10;
                local_660.vec[3] = CONCAT26(uVar21,(undefined6)local_660.vec[3]);
              }
            }
            bVar13 = false;
            lVar16 = 0;
            pSVar15 = &local_420;
            do {
              lVar17 = 0x10;
              do {
                puVar2 = (undefined8 *)
                         ((long)local_600.bands[lVar16 + -1][2].eliminations.vec + lVar17);
                uVar6 = puVar2[1];
                puVar3 = (undefined8 *)
                         ((long)(pSVar15->bands + 0xffffffffffffffff) + 0x50U + lVar17);
                *puVar3 = *puVar2;
                puVar3[1] = uVar6;
                puVar2 = (undefined8 *)
                         ((long)local_600.bands[lVar16][0].configurations.vec + lVar17);
                uVar6 = puVar2[1];
                puVar3 = (undefined8 *)((long)pSVar15->bands[0] + lVar17);
                *puVar3 = *puVar2;
                puVar3[1] = uVar6;
                lVar17 = lVar17 + 0x20;
              } while (lVar17 != 0x70);
              lVar16 = 1;
              bVar14 = !bVar13;
              bVar13 = true;
              pSVar15 = (State *)(local_420.bands + 1);
            } while (bVar14);
            memcpy(local_638,local_628,0x120);
            bVar13 = anon_unknown.dwarf_43::SolverDpllTriadSimd<0>::BoxRestrict<0>
                               (&local_420,iVar23,&local_660);
            pcVar12 = local_630;
            iVar23 = 0;
            if (bVar13) {
              cVar19 = (char)uVar5 + (char)uVar22 * -9 + '1';
              if (pencilmark) {
                uVar22 = uVar5;
              }
              cVar4 = local_630[(int)uVar22];
              if (pencilmark) {
                cVar19 = '.';
              }
              local_630[(int)uVar22] = cVar19;
              bVar14 = false;
              lVar16 = 0;
              pSVar15 = &local_240;
              do {
                lVar17 = 0x10;
                do {
                  puVar2 = (undefined8 *)
                           ((long)(local_420.bands + lVar16 + 0xffffffffffffffff) + 0x50U + lVar17);
                  uVar6 = puVar2[1];
                  puVar3 = (undefined8 *)((long)(pSVar15->bands + -1) + 0x50 + lVar17);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar6;
                  puVar2 = (undefined8 *)((long)(local_420.bands + lVar16) + lVar17);
                  uVar6 = puVar2[1];
                  puVar3 = (undefined8 *)((long)pSVar15->bands[0][0].configurations.vec + lVar17);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar6;
                  lVar17 = lVar17 + 0x20;
                } while (lVar17 != 0x70);
                lVar16 = 1;
                bVar11 = !bVar14;
                bVar14 = true;
                pSVar15 = (State *)(local_240.bands + 1);
              } while (bVar11);
              memcpy(local_620,local_638,0x120);
              (anonymous_namespace)::generator._480_8_ = 2;
              (anonymous_namespace)::generator._488_8_ = 0;
              anon_unknown.dwarf_43::SolverDpllTriadSimd<0>::
              CountSolutionsConsistentWithPartialAssignment
                        ((SolverDpllTriadSimd<0> *)(anonymous_namespace)::generator,&local_240);
              if ((anonymous_namespace)::generator._488_8_ == 1) {
                iVar23 = 1;
              }
              else {
                if ((anonymous_namespace)::generator._488_8_ == 0) {
                  pcVar12[(int)uVar22] = cVar4;
                }
                else {
                  memcpy(&local_600,&local_420,0x1e0);
                }
                iVar23 = 3;
              }
            }
            puzzle = local_630;
            if (bVar13) goto LAB_0010447e;
          }
          iVar23 = 0;
        }
      }
      else if (puzzle[(int)uVar22] == '.') goto LAB_00104131;
LAB_0010447e:
      if ((iVar23 != 3) && (iVar23 != 0)) break;
      puVar24 = puVar24 + 1;
      bVar25 = puVar24 !=
               (uint *)local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
    } while (bVar25);
  }
  if (local_640 != (uint *)0x0) {
    operator_delete(local_640,
                    (long)local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - (long)local_640);
  }
  return bVar25;
}

Assistant:

bool TdokuConstrain(bool pencilmark, char *puzzle) {
    return generator.Constrain(pencilmark, puzzle);
}